

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int mbedtls_ecjpake_setup
              (mbedtls_ecjpake_context *ctx,mbedtls_ecjpake_role role,mbedtls_md_type_t hash,
              mbedtls_ecp_group_id curve,uchar *secret,size_t len)

{
  mbedtls_md_info_t *pmVar1;
  int local_3c;
  int ret;
  size_t len_local;
  uchar *secret_local;
  mbedtls_ecp_group_id curve_local;
  mbedtls_md_type_t hash_local;
  mbedtls_ecjpake_role role_local;
  mbedtls_ecjpake_context *ctx_local;
  
  if ((role == MBEDTLS_ECJPAKE_CLIENT) || (role == MBEDTLS_ECJPAKE_SERVER)) {
    ctx->role = role;
    pmVar1 = mbedtls_md_info_from_type(hash);
    if (pmVar1 == (mbedtls_md_info_t *)0x0) {
      ctx_local._4_4_ = -0x5080;
    }
    else {
      ctx->md_type = hash;
      local_3c = mbedtls_ecp_group_load(&ctx->grp,curve);
      if (local_3c == 0) {
        local_3c = mbedtls_mpi_read_binary(&ctx->s,secret,len);
      }
      if (local_3c != 0) {
        mbedtls_ecjpake_free(ctx);
      }
      ctx_local._4_4_ = local_3c;
    }
  }
  else {
    ctx_local._4_4_ = -0x4f80;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecjpake_setup(mbedtls_ecjpake_context *ctx,
                          mbedtls_ecjpake_role role,
                          mbedtls_md_type_t hash,
                          mbedtls_ecp_group_id curve,
                          const unsigned char *secret,
                          size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (role != MBEDTLS_ECJPAKE_CLIENT && role != MBEDTLS_ECJPAKE_SERVER) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    ctx->role = role;

    if ((mbedtls_md_info_from_type(hash)) == NULL) {
        return MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE;
    }

    ctx->md_type = hash;

    MBEDTLS_MPI_CHK(mbedtls_ecp_group_load(&ctx->grp, curve));

    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&ctx->s, secret, len));

cleanup:
    if (ret != 0) {
        mbedtls_ecjpake_free(ctx);
    }

    return ret;
}